

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

IRNode * __thiscall kratos::Expr::get_child(Expr *this,uint64_t index)

{
  Expr *local_30;
  uint64_t index_local;
  Expr *this_local;
  
  if (index == 0) {
    this_local = (Expr *)this->left;
  }
  else if (index == 1) {
    if (this->right == (Var *)0x0) {
      local_30 = (Expr *)0x0;
    }
    else {
      local_30 = (Expr *)this->right;
    }
    this_local = local_30;
  }
  else {
    this_local = (Expr *)0x0;
  }
  return (IRNode *)this_local;
}

Assistant:

IRNode *Expr::get_child(uint64_t index) {
    if (index == 0)
        return left;
    else if (index == 1)
        return right ? right : nullptr;
    else
        return nullptr;
}